

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

void PL_ERROR(connectdata *conn,CURLcode err)

{
  long lVar1;
  ftp_parselist_data *parser;
  ftp_wc_tmpdata *tmpdata;
  CURLcode err_local;
  connectdata *conn_local;
  
  lVar1 = *(conn->data->wildcard).tmp;
  if (*(long *)(lVar1 + 0x10) != 0) {
    Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar1 + 0x10));
  }
  *(undefined8 *)(lVar1 + 0x10) = 0;
  *(CURLcode *)(lVar1 + 0xc) = err;
  return;
}

Assistant:

static void PL_ERROR(struct connectdata *conn, CURLcode err)
{
  struct ftp_wc_tmpdata *tmpdata = conn->data->wildcard.tmp;
  struct ftp_parselist_data *parser = tmpdata->parser;
  if(parser->file_data)
    Curl_fileinfo_dtor(NULL, parser->file_data);
  parser->file_data = NULL;
  parser->error = err;
}